

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void NULLCFile::FileOpen(NULLCArray name,NULLCArray access,File *file)

{
  FILE *pFVar1;
  char *local_60;
  char *local_50;
  File *file_local;
  NULLCArray access_local;
  NULLCArray name_local;
  
  local_60 = access.ptr;
  local_50 = name.ptr;
  if (file == (File *)0x0) {
    nullcThrowError("ERROR: null pointer access");
  }
  else {
    if ((file->flag & 1U) != 0) {
      fclose((FILE *)file->handle);
    }
    file->flag = 1;
    if (local_50 == (char *)0x0) {
      local_50 = "";
    }
    if (local_60 == (char *)0x0) {
      local_60 = "";
    }
    pFVar1 = fopen(local_50,local_60);
    file->handle = (FILE *)pFVar1;
    if (file->handle == (FILE *)0x0) {
      file->flag = 0;
    }
  }
  return;
}

Assistant:

void FileOpen(NULLCArray name, NULLCArray access, File* file)
	{
		if(!file)
		{
			nullcThrowError("ERROR: null pointer access");
			return;
		}

		if(file->flag & FILE_OPENED)
			fclose(file->handle);

		file->flag = FILE_OPENED;
		file->handle = fopen(name.ptr ? name.ptr : "", access.ptr ? access.ptr : "");

		if(!file->handle)
			file->flag = 0;
	}